

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_overview_csv_actions::module_start(module_overview_csv_actions *this,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)module);
  std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  this->first_module_ = true;
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << module << s_csv_separator;
        first_module_ = true;
    }